

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalGenerator.cxx
# Opt level: O0

int __thiscall
cmGlobalGenerator::TryCompile
          (cmGlobalGenerator *this,int jobs,string *srcdir,string *bindir,string *projectName,
          string *target,bool fast,string *output,cmMakefile *mf)

{
  cmake *this_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string *bindir_00;
  string *psVar1;
  bool bVar2;
  int iVar3;
  cmState *this_01;
  ulong uVar4;
  string *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_388;
  string local_348 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_328;
  cmDuration local_308;
  allocator<char> local_2f9;
  string local_2f8;
  int local_2d4;
  stringstream local_2d0 [4];
  int ret;
  stringstream ostr;
  ostream local_2c0;
  cmBuildOptions local_144;
  cmBuildOptions defaultBuildOptions;
  undefined1 local_118 [8];
  string config;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  iterator local_d0;
  size_type local_c8;
  undefined1 local_c0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  newTarget;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  cmValue local_48;
  byte local_39;
  string *psStack_38;
  bool fast_local;
  string *target_local;
  string *projectName_local;
  string *bindir_local;
  string *srcdir_local;
  cmGlobalGenerator *pcStack_10;
  int jobs_local;
  cmGlobalGenerator *this_local;
  
  local_39 = fast;
  psStack_38 = target;
  target_local = projectName;
  projectName_local = bindir;
  bindir_local = srcdir;
  srcdir_local._4_4_ = jobs;
  pcStack_10 = this;
  this_01 = cmake::GetState(this->CMakeInstance);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_68,"CMAKE_NUMBER_OF_MAKEFILES",&local_69);
  local_48 = cmState::GetInitializedCacheValue(this_01,&local_68);
  bVar2 = cmValue::operator_cast_to_bool(&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  if (((bVar2 ^ 0xffU) & 1) != 0) {
    this->FirstTimeProgress = (1.0 - this->FirstTimeProgress) / 30.0 + this->FirstTimeProgress;
    if (0.95 < this->FirstTimeProgress) {
      this->FirstTimeProgress = 0.95;
    }
    this_00 = this->CMakeInstance;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"Configuring",
               (allocator<char> *)
               ((long)&newTarget.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    cmake::UpdateProgress(this_00,&local_a0,this->FirstTimeProgress);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&newTarget.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  }
  memset(local_c0,0,0x18);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_c0);
  uVar4 = std::__cxx11::string::empty();
  if ((uVar4 & 1) == 0) {
    config.field_2._8_8_ = &local_f0;
    std::__cxx11::string::string((string *)config.field_2._8_8_,(string *)psStack_38);
    local_d0 = &local_f0;
    local_c8 = 1;
    __l._M_len = 1;
    __l._M_array = local_d0;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::operator=((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_c0,__l);
    local_388 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_d0;
    do {
      local_388 = local_388 + -1;
      std::__cxx11::string::~string((string *)local_388);
    } while (local_388 != &local_f0);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&defaultBuildOptions.ResolveMode,"CMAKE_TRY_COMPILE_CONFIGURATION",
             (allocator<char> *)&defaultBuildOptions.field_0x3);
  psVar5 = cmMakefile::GetSafeDefinition(mf,(string *)&defaultBuildOptions.ResolveMode);
  std::__cxx11::string::string((string *)local_118,(string *)psVar5);
  std::__cxx11::string::~string((string *)&defaultBuildOptions.ResolveMode);
  std::allocator<char>::~allocator((allocator<char> *)&defaultBuildOptions.field_0x3);
  cmBuildOptions::cmBuildOptions(&local_144,false,(bool)(local_39 & 1),Disable);
  std::__cxx11::stringstream::stringstream(local_2d0);
  iVar3 = srcdir_local._4_4_;
  psVar1 = bindir_local;
  bindir_00 = projectName_local;
  psVar5 = target_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"",&local_2f9);
  local_308.__r = (this->TryCompileTimeout).__r;
  local_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_328.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_328);
  iVar3 = Build(this,iVar3,psVar1,bindir_00,psVar5,
                (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_c0,&local_2c0,&local_2f8,(string *)local_118,&local_144,true,local_308,
                OUTPUT_NONE,&local_328);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_328);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  local_2d4 = iVar3;
  std::__cxx11::stringstream::str();
  std::__cxx11::string::operator=((string *)output,local_348);
  std::__cxx11::string::~string(local_348);
  iVar3 = local_2d4;
  std::__cxx11::stringstream::~stringstream(local_2d0);
  std::__cxx11::string::~string((string *)local_118);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_c0);
  return iVar3;
}

Assistant:

int cmGlobalGenerator::TryCompile(int jobs, const std::string& srcdir,
                                  const std::string& bindir,
                                  const std::string& projectName,
                                  const std::string& target, bool fast,
                                  std::string& output, cmMakefile* mf)
{
  // if this is not set, then this is a first time configure
  // and there is a good chance that the try compile stuff will
  // take the bulk of the time, so try and guess some progress
  // by getting closer and closer to 100 without actually getting there.
  if (!this->CMakeInstance->GetState()->GetInitializedCacheValue(
        "CMAKE_NUMBER_OF_MAKEFILES")) {
    // If CMAKE_NUMBER_OF_MAKEFILES is not set
    // we are in the first time progress and we have no
    // idea how long it will be.  So, just move 1/10th of the way
    // there each time, and don't go over 95%
    this->FirstTimeProgress += ((1.0f - this->FirstTimeProgress) / 30.0f);
    if (this->FirstTimeProgress > 0.95f) {
      this->FirstTimeProgress = 0.95f;
    }
    this->CMakeInstance->UpdateProgress("Configuring",
                                        this->FirstTimeProgress);
  }

  std::vector<std::string> newTarget = {};
  if (!target.empty()) {
    newTarget = { target };
  }
  std::string config =
    mf->GetSafeDefinition("CMAKE_TRY_COMPILE_CONFIGURATION");
  cmBuildOptions defaultBuildOptions(false, fast, PackageResolveMode::Disable);

  std::stringstream ostr;
  auto ret =
    this->Build(jobs, srcdir, bindir, projectName, newTarget, ostr, "", config,
                defaultBuildOptions, true, this->TryCompileTimeout);
  output = ostr.str();
  return ret;
}